

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O1

Bond_p __thiscall indigox::Molecule::NewBond(Molecule *this,Atom_p *a,Atom_p *b)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  element_type *this_00;
  MolecularGraph *this_01;
  MolVertex u;
  MolVertex v;
  Atom *pAVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Bond *this_02;
  mapped_type *ppvVar4;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  Bond_p BVar6;
  MolEdgeBool eb;
  undefined1 local_d8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Bond_p local_a0;
  Bond_p local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  Atom_p local_70;
  Atom_p local_60;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  Atom_p local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  (this->super_CountableObject<indigox::Molecule>).id_ = 0;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  Atom::GetMolecule((Atom *)local_d8);
  __r = &(a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  std::__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<indigox::Molecule,void>
            ((__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x28),
             (__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)__r);
  uVar3 = local_b0._M_allocated_capacity;
  uVar2 = local_d8._0_8_;
  _Var5._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    _Var5._M_pi = extraout_RDX_00;
  }
  if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    _Var5._M_pi = extraout_RDX_01;
  }
  if (uVar2 == uVar3) {
    Atom::GetMolecule((Atom *)local_d8);
    std::__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<indigox::Molecule,void>
              ((__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x28),
               (__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)__r);
    uVar2 = local_d8._0_8_;
    _Var5._M_pi = extraout_RDX_02;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
      _Var5._M_pi = extraout_RDX_03;
    }
    if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      _Var5._M_pi = extraout_RDX_04;
    }
    if (uVar2 == local_b0._M_allocated_capacity) {
      local_40.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_40.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_40.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_40.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_40.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_50 = (in_RCX->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_48 = (in_RCX->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                 ._M_pi;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_48->_M_use_count = local_48->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_48->_M_use_count = local_48->_M_use_count + 1;
        }
      }
      BVar6 = GetBond((Molecule *)local_d8,a,&local_40);
      uVar3 = local_d8._8_8_;
      uVar2 = local_d8._0_8_;
      _Var5 = BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_d8._0_8_ = 0;
      local_d8._8_8_ = (element_type *)0x0;
      this_00 = (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_CountableObject<indigox::Molecule>).id_ = uVar2;
      (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
      super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar3
      ;
      if (this_00 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        _Var5._M_pi = extraout_RDX_05;
      }
      if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        _Var5._M_pi = extraout_RDX_06;
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        _Var5._M_pi = extraout_RDX_07;
      }
      if (local_40.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var5._M_pi = extraout_RDX_08;
      }
      if ((this->super_CountableObject<indigox::Molecule>).id_ == 0) {
        this_02 = (Bond *)operator_new(0x58);
        local_60.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_60.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        if (local_60.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_60.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_60.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        local_70.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (in_RCX->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_70.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (in_RCX->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if (local_70.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_70.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_70.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_70.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_70.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        Bond::Bond(this_02,&local_60,&local_70);
        std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::reset<indigox::Bond>
                  ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this,this_02);
        if (local_70.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_60.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::vector<std::shared_ptr<indigox::Bond>,std::allocator<std::shared_ptr<indigox::Bond>>>::
        emplace_back<std::shared_ptr<indigox::Bond>&>
                  ((vector<std::shared_ptr<indigox::Bond>,std::allocator<std::shared_ptr<indigox::Bond>>>
                    *)&a[5].super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(shared_ptr<indigox::Bond> *)this);
        local_d8._0_8_ =
             Bond::GetIndex((Bond *)(this->super_CountableObject<indigox::Molecule>).id_);
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_long,std::shared_ptr<indigox::Bond>&>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&a[10].super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,local_d8,this);
        this_01 = (MolecularGraph *)
                  a[0x14].super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ppvVar4 = std::
                  map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                  ::at((map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                        *)(a + 0xe),b);
        u = *ppvVar4;
        ppvVar4 = std::
                  map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                  ::at((map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                        *)(a + 0xe),in_RCX);
        v = *ppvVar4;
        local_80._M_allocated_capacity = (this->super_CountableObject<indigox::Molecule>).id_;
        local_80._8_8_ =
             (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
             super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((element_type *)local_80._8_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)local_80._8_8_)->
                     super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                     super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((element_type *)local_80._8_8_)->
                          super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                          super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
            ;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)local_80._8_8_)->
                     super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                     super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((element_type *)local_80._8_8_)->
                          super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                          super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
            ;
          }
        }
        MolecularGraph::AddEdge((MolEdgeBool *)local_d8,this_01,u,v,(Bond_p *)&local_80);
        if ((element_type *)local_80._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
        }
        std::
        _Rb_tree<std::shared_ptr<indigox::Bond>,std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>,std::_Select1st<std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>>,std::less<std::shared_ptr<indigox::Bond>>,std::allocator<std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>>>
        ::
        _M_emplace_unique<std::shared_ptr<indigox::Bond>&,boost::detail::edge_desc_impl<boost::undirected_tag,void*>&>
                  ((_Rb_tree<std::shared_ptr<indigox::Bond>,std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>,std::_Select1st<std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>>,std::less<std::shared_ptr<indigox::Bond>>,std::allocator<std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>>>
                    *)(a + 0x11),(shared_ptr<indigox::Bond> *)this,
                   (edge_desc_impl<boost::undirected_tag,_void_*> *)local_d8);
        pAVar1 = (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_90.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(this->super_CountableObject<indigox::Molecule>).id_;
        local_90.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
             super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((element_type *)
            local_90.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)
                      local_90.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                     _M_weak_this.super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_90.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                          _M_weak_this.
                          super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
            ;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)
                      local_90.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                     _M_weak_this.super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_90.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                          _M_weak_this.
                          super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
            ;
          }
        }
        Atom::AddBond(pAVar1,&local_90);
        if ((element_type *)
            local_90.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pAVar1 = (in_RCX->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a0.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(this->super_CountableObject<indigox::Molecule>).id_;
        local_a0.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
             super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((element_type *)
            local_a0.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)
                      local_a0.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                     _M_weak_this.super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_a0.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                          _M_weak_this.
                          super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
            ;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)
                      local_a0.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                     _M_weak_this.super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_a0.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                          _M_weak_this.
                          super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
            ;
          }
        }
        Atom::AddBond(pAVar1,&local_a0);
        _Var5._M_pi = extraout_RDX_09;
        if ((element_type *)
            local_a0.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          _Var5._M_pi = extraout_RDX_10;
        }
        *(undefined1 *)
         &a[0x15].super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             1;
      }
    }
  }
  BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Bond_p)BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::NewBond(Atom_p a, Atom_p b) {
  /// @todo Logging for fail reasons.
  Bond_p bnd = Bond_p();
  if (a->GetMolecule() != shared_from_this()) return bnd;
  if (b->GetMolecule() != shared_from_this()) return bnd;
  bnd = GetBond(a, b);
  if (!bnd) {
    bnd.reset(new Bond(a, b));
    bonds_.emplace_back(bnd);
    idx_to_bond_.emplace(bnd->GetIndex(), bnd);
    MolEdgeBool eb = graph_->AddEdge(atom_to_vertex_.at(a),
                                     atom_to_vertex_.at(b), bnd);
    bond_to_edge_.emplace(bnd, eb.first);
    a->AddBond(bnd);
    b->AddBond(bnd);
    modified_ = true;
  } // else Log that bond already exists.
  return bnd;
}